

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O2

Query * flatten_trivial_operations(Query *__return_storage_ptr__,Query *q,bool *changed)

{
  QueryType *pQVar1;
  vector<Query,_std::allocator<Query>_> *pvVar2;
  
  pQVar1 = Query::get_type(q);
  if (*pQVar1 == AND) {
    pvVar2 = Query::as_queries(q);
    if ((long)(pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_start != 0x48) goto LAB_00140e11;
  }
  else {
LAB_00140e11:
    pQVar1 = Query::get_type(q);
    if (*pQVar1 != OR) goto LAB_00140e42;
    pvVar2 = Query::as_queries(q);
    if ((long)(pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
              super__Vector_impl_data._M_start != 0x48) goto LAB_00140e42;
  }
  *changed = true;
  pvVar2 = Query::as_queries(q);
  q = (pvVar2->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.super__Vector_impl_data.
      _M_start;
LAB_00140e42:
  Query::Query(__return_storage_ptr__,q);
  return __return_storage_ptr__;
}

Assistant:

Query flatten_trivial_operations(Query &&q, bool *changed) {
    if (q.get_type() == QueryType::AND && q.as_queries().size() == 1) {
        *changed = true;
        return std::move(q.as_queries()[0]);
    }
    if (q.get_type() == QueryType::OR && q.as_queries().size() == 1) {
        *changed = true;
        return std::move(q.as_queries()[0]);
    }
    return std::move(q);
}